

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parametric.cxx
# Opt level: O0

string * __thiscall
Parametric::getAllParameters_abi_cxx11_(string *__return_storage_ptr__,Parametric *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  uint local_5c;
  uint local_58;
  uint i_1;
  uint i;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string indent;
  Parametric *this_local;
  string *params;
  
  parametricOutputIndent = parametricOutputIndent + 1;
  indent.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  for (local_58 = 0; local_58 < parametricOutputIndent; local_58 = local_58 + 1) {
    std::__cxx11::string::operator+=((string *)local_40,"\t");
  }
  local_5c = 0;
  while( true ) {
    uVar1 = (ulong)local_5c;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->parametricStrings);
    if (sVar2 <= uVar1) break;
    parametricOutputLineEnd = true;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->parametricStrings,(ulong)local_5c);
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   pvVar3);
    std::operator+(&local_a0,&local_c0,": ");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->parametricStrings,(ulong)local_5c);
    (*this->_vptr_Parametric[3])(&local_e0,this,pvVar3);
    std::operator+(&local_80,&local_a0,&local_e0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if ((parametricOutputLineEnd & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
      parametricOutputLineEnd = false;
    }
    local_5c = local_5c + 1;
  }
  parametricOutputIndent = parametricOutputIndent - 1;
  indent.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((indent.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string Parametric::getAllParameters() const
{
	++parametricOutputIndent;
	string params;
	string indent = "";
	for (uint i=0; i<parametricOutputIndent; ++i)
		indent += "\t";
	for (uint i=0; i<parametricStrings.size(); ++i) {
		parametricOutputLineEnd = true;
		params += indent + parametricStrings[i] + ": " + getParameter( parametricStrings[i] );
		if (parametricOutputLineEnd) {
			params += "\n";
			parametricOutputLineEnd = false;
		}
	}
	--parametricOutputIndent;
	return params;
}